

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O0

void uavs3d_funs_init_mc_c(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    uavs3d_funs_handle.ipcpy[local_c] = uavs3d_if_cpy;
    uavs3d_funs_handle.ipflt[0][local_c] = uavs3d_if_hor_luma;
    uavs3d_funs_handle.ipflt[1][local_c] = uavs3d_if_hor_chroma;
    uavs3d_funs_handle.ipflt[2][local_c] = uavs3d_if_ver_luma;
    (*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
      (uavs3d_funs_handle.ipflt_ext + -1))[local_c] = uavs3d_if_ver_chroma;
    uavs3d_funs_handle.ipflt_ext[0][local_c] = uavs3d_if_hor_ver_luma;
    uavs3d_funs_handle.avg_pel[(long)local_c + -6] = uavs3d_if_hor_ver_chroma;
    uavs3d_funs_handle.avg_pel[local_c] = uavs3d_avg_pel;
  }
  return;
}

Assistant:

void uavs3d_funs_init_mc_c() {
    int i;
    for (i = 0; i < BLOCK_WIDTH_TYPES_NUM; i++) {
        uavs3d_funs_handle.ipcpy[i] = uavs3d_if_cpy;
        uavs3d_funs_handle.ipflt[IPFILTER_H_8][i] = uavs3d_if_hor_luma;
        uavs3d_funs_handle.ipflt[IPFILTER_H_4][i] = uavs3d_if_hor_chroma;
        uavs3d_funs_handle.ipflt[IPFILTER_V_8][i] = uavs3d_if_ver_luma;
        uavs3d_funs_handle.ipflt[IPFILTER_V_4][i] = uavs3d_if_ver_chroma;
        uavs3d_funs_handle.ipflt_ext[IPFILTER_EXT_8][i] = uavs3d_if_hor_ver_luma;
        uavs3d_funs_handle.ipflt_ext[IPFILTER_EXT_4][i] = uavs3d_if_hor_ver_chroma;
        uavs3d_funs_handle.avg_pel[i]   = uavs3d_avg_pel;
    }
}